

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O2

void __thiscall binlog::EventStream::readEvent(EventStream *this,uint64_t eventSourceId,Range range)

{
  mapped_type *pmVar1;
  unsigned_long uVar2;
  runtime_error *this_00;
  uint64_t eventSourceId_local;
  Range range_local;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  range_local._end = range._end;
  range_local._begin = range._begin;
  eventSourceId_local = eventSourceId;
  pmVar1 = detail::SegmentedMap<binlog::EventSource>::find
                     (&this->_eventSources,&eventSourceId_local);
  if (pmVar1 != (mapped_type *)0x0) {
    (this->_event).source = pmVar1;
    uVar2 = Range::read<unsigned_long>(&range_local);
    (this->_event).clockValue = uVar2;
    (this->_event).arguments._begin = range_local._begin;
    (this->_event).arguments._end = range_local._end;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_58,eventSourceId_local);
  std::operator+(&local_38,"Event has invalid source id: ",&local_58);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void EventStream::readEvent(std::uint64_t eventSourceId, Range range)
{
  auto&& it = _eventSources.find(eventSourceId);
  if (it == _eventSources.end())
  {
    throw std::runtime_error("Event has invalid source id: " + std::to_string(eventSourceId));
  }

  _event.source = it;
  _event.clockValue = range.read<std::uint64_t>();
  _event.arguments = range;
}